

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O1

void __thiscall
absl::log_internal::LogMessage::LogMessageData::LogMessageData
          (LogMessageData *this,char *file,int line,LogSeverity severity,Time timestamp)

{
  long lVar1;
  bool bVar2;
  LogSeverity LVar3;
  pid_t pVar4;
  size_t sVar5;
  long lVar6;
  long lVar7;
  LogSeverity LVar8;
  
  (this->entry).timestamp_.rep_.rep_hi_.lo_ = 0;
  (this->entry).timestamp_.rep_.rep_hi_.hi_ = 0;
  (this->entry).timestamp_.rep_.rep_lo_ = 0;
  (this->entry).text_message_with_prefix_and_newline_and_nul_.ptr_ = (pointer)0x0;
  (this->entry).text_message_with_prefix_and_newline_and_nul_.len_ = 0;
  (this->entry).encoding_._M_len = 0;
  (this->entry).encoding_._M_str = (char *)0x0;
  (this->entry).full_filename_._M_len = 0;
  (this->entry).full_filename_._M_str = (char *)0x0;
  (this->entry).base_filename_._M_len = 0;
  (this->entry).base_filename_._M_str = (char *)0x0;
  (this->entry).stacktrace_._M_dataplus._M_p = (pointer)&(this->entry).stacktrace_.field_2;
  (this->entry).stacktrace_._M_string_length = 0;
  (this->entry).stacktrace_.field_2._M_local_buf[0] = '\0';
  (this->extra_sinks).storage_.metadata_.
  super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::allocator<absl::LogSink_*>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
  .super_Storage<unsigned_long,_1UL,_false>.value = 0;
  this->extra_sinks_only = false;
  std::ostream::ostream(&this->manipulated,(streambuf *)0x0);
  (this->encoded_remaining).ptr_ = (this->encoded_buf)._M_elems;
  (this->encoded_remaining).len_ = 15000;
  *(uint *)(&this->field_0x138 + *(long *)(*(long *)&this->manipulated + -0x18)) =
       *(uint *)(&this->field_0x138 + *(long *)(*(long *)&this->manipulated + -0x18)) | 0x201;
  sVar5 = strlen(file);
  (this->entry).full_filename_._M_len = sVar5;
  (this->entry).full_filename_._M_str = file;
  sVar5 = strlen(file);
  lVar6 = 0;
  if (sVar5 != 0) {
    lVar7 = sVar5 + 1;
    do {
      if (lVar7 == 1) {
        lVar6 = 0;
        break;
      }
      lVar6 = lVar7 + -1;
      lVar1 = lVar7 + -2;
      lVar7 = lVar6;
    } while (file[lVar1] != '/');
  }
  (this->entry).base_filename_._M_len = sVar5 - lVar6;
  (this->entry).base_filename_._M_str = file + lVar6;
  (this->entry).line_ = line;
  bVar2 = ShouldPrependLogPrefix();
  (this->entry).prefix_ = bVar2;
  LVar8 = kInfo;
  if (0 < (int)severity) {
    LVar8 = severity;
  }
  LVar3 = kError;
  if ((int)severity < 4) {
    LVar3 = LVar8;
  }
  (this->entry).severity_ = LVar3;
  (this->entry).verbose_level_ = -1;
  (this->entry).timestamp_.rep_.rep_hi_ = timestamp.rep_.rep_hi_;
  (this->entry).timestamp_.rep_.rep_lo_ = timestamp.rep_.rep_lo_;
  pVar4 = base_internal::GetCachedTID();
  (this->entry).tid_ = pVar4;
  return;
}

Assistant:

LogMessage::LogMessageData::LogMessageData(const char* file, int line,
                                           absl::LogSeverity severity,
                                           absl::Time timestamp)
    : extra_sinks_only(false),
      manipulated(nullptr),
      // This `absl::MakeSpan` silences spurious -Wuninitialized from GCC:
      encoded_remaining(absl::MakeSpan(encoded_buf)) {
  // Legacy defaults for LOG's ostream:
  manipulated.setf(std::ios_base::showbase | std::ios_base::boolalpha);
  entry.full_filename_ = file;
  entry.base_filename_ = Basename(file);
  entry.line_ = line;
  entry.prefix_ = absl::ShouldPrependLogPrefix();
  entry.severity_ = absl::NormalizeLogSeverity(severity);
  entry.verbose_level_ = absl::LogEntry::kNoVerbosityLevel;
  entry.timestamp_ = timestamp;
  entry.tid_ = absl::base_internal::GetCachedTID();
}